

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O3

void m68k_op_move_16_toc_al(void)

{
  uint uVar1;
  
  uVar1 = OPER_AL_16();
  m68ki_cpu.x_flag = uVar1 << 4 & 0x100;
  m68ki_cpu.n_flag = uVar1 << 4 & 0x80;
  m68ki_cpu.not_z_flag = (uint)((uVar1 & 4) == 0);
  m68ki_cpu.v_flag = (uVar1 & 2) << 6;
  m68ki_cpu.c_flag = (uVar1 & 1) << 8;
  return;
}

Assistant:

static void m68k_op_move_16_toc_al(void)
{
	m68ki_set_ccr(OPER_AL_16());
}